

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

ProcessorInstanceRef * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::getOrCreateImplicitProcessorInstance
          (QualifiedIdentifierResolver *this,Context *c,ProcessorBase *processor,
          pool_ptr<soul::AST::Expression> *arguments)

{
  Allocator *this_00;
  SharedEndpoint *pSVar1;
  QualifiedIdentifierResolver *pQVar2;
  __type_conflict1 _Var3;
  Graph *pGVar4;
  Expression *pEVar5;
  ProcessorInstance *pPVar6;
  string *__rhs;
  UnqualifiedName *pUVar7;
  ProcessorRef *pPVar8;
  ProcessorInstanceRef *pPVar9;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *args;
  Identifier *args_00;
  pointer ppVar10;
  pointer ppVar11;
  pool_ptr<soul::AST::Graph> currentGraph;
  pool_ref<soul::AST::ProcessorInstance> i;
  string name;
  string signature;
  pool_ptr<soul::AST::Graph> local_168;
  QualifiedIdentifierResolver *local_160;
  pool_ptr<soul::AST::Expression> *local_158;
  pointer local_150;
  ASTUtilities *local_148;
  pool_ptr<soul::AST::Expression> local_140;
  ProcessorBase *local_138;
  pool_ref<soul::AST::ProcessorInstance> local_130;
  string local_128;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_108;
  pool_ptr<soul::AST::ModuleBase> local_d0;
  pool_ptr<soul::AST::Expression> local_c8;
  string local_c0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_c8 = (pool_ptr<soul::AST::Expression>)arguments->object;
  local_158 = arguments;
  AST::CommaSeparatedList::getAsExpressionList(&local_108,&local_c8);
  local_148 = (ASTUtilities *)&(processor->super_ModuleBase).specialisationParams;
  ASTUtilities::
  getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
            (&local_c0,local_148,
             (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
              *)&local_108,
             (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)arguments);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::clear(&local_108);
  local_d0.object = (this->currentModule).object;
  cast<soul::AST::Graph,soul::AST::ModuleBase>((soul *)&local_168,&local_d0);
  if (local_168.object == (Graph *)0x0) {
    throwInternalCompilerError
              ("currentGraph != nullptr","getOrCreateImplicitProcessorInstance",0x409);
  }
  local_160 = this;
  pGVar4 = pool_ptr<soul::AST::Graph>::operator->(&local_168);
  ppVar10 = (pGVar4->processorInstances).
            super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar11 = (pGVar4->processorInstances).
            super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_150 = ppVar11;
  do {
    pQVar2 = local_160;
    if (ppVar10 == ppVar11) {
      pPVar6 = PoolAllocator::allocate<soul::AST::ProcessorInstance,soul::AST::Context&>
                         (&((local_160->super_ModuleInstanceResolver).
                            super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c);
      if (local_158->object == (Expression *)0x0) {
        pUVar7 = PoolAllocator::
                 allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                           (&((pQVar2->super_ModuleInstanceResolver).
                              super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,
                            &(processor->super_ModuleBase).name);
        (pPVar6->instanceName).object = pUVar7;
      }
      else {
        pGVar4 = pool_ptr<soul::AST::Graph>::operator->(&local_168);
        __rhs = Identifier::toString_abi_cxx11_(&(processor->super_ModuleBase).name);
        std::operator+(&local_128,"_instance_",__rhs);
        AST::Scope::makeUniqueName
                  ((string *)&local_108,&(pGVar4->super_ProcessorBase).super_ModuleBase.super_Scope,
                   &local_128);
        std::__cxx11::string::~string((string *)&local_128);
        this_00 = (pQVar2->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                  allocator;
        local_128._M_dataplus._M_p =
             (pointer)AST::Allocator::get<std::__cxx11::string>
                                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_108);
        pUVar7 = PoolAllocator::
                 allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier>
                           (&this_00->pool,c,(Identifier *)&local_128);
        (pPVar6->instanceName).object = pUVar7;
        std::__cxx11::string::~string((string *)&local_108);
      }
      pPVar8 = PoolAllocator::
               allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                         (&((pQVar2->super_ModuleInstanceResolver).
                            super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,processor);
      (pPVar6->targetProcessor).object = &pPVar8->super_Expression;
      (pPVar6->specialisationArgs).object = local_158->object;
      (pPVar6->implicitInstanceSource).object = (pQVar2->currentConnectionEndpoint).object;
      pGVar4 = pool_ptr<soul::AST::Graph>::operator->(&local_168);
      AST::Graph::addProcessorInstance(pGVar4,pPVar6);
      pPVar9 = PoolAllocator::
               allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::AST::ProcessorInstance&>
                         (&((pQVar2->super_ModuleInstanceResolver).
                            super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,pPVar6);
LAB_0021b46b:
      std::__cxx11::string::~string((string *)&local_c0);
      return pPVar9;
    }
    pPVar6 = ppVar10->object;
    local_130.object = pPVar6;
    pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&pPVar6->targetProcessor);
    args = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
           (pEVar5->super_Statement).super_ASTObject._vptr_ASTObject;
    (*(code *)args->space[3])(&local_138,pEVar5);
    if (local_138 == processor) {
      local_140.object = (pPVar6->specialisationArgs).object;
      AST::CommaSeparatedList::getAsExpressionList(&local_108,&local_140);
      ASTUtilities::
      getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
                (&local_128,local_148,
                 (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                  *)&local_108,args);
      _Var3 = std::operator==(&local_c0,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::clear(&local_108);
      ppVar11 = local_150;
      if (_Var3) {
        pSVar1 = (pPVar6->implicitInstanceSource).object;
        if (pSVar1 == (SharedEndpoint *)0x0) {
          Errors::cannotUseProcessorInLet<soul::Identifier&>
                    (&local_68,(Errors *)&(processor->super_ModuleBase).name,args_00);
          AST::Context::throwError(c,&local_68,false);
        }
        if (pSVar1 != (local_160->currentConnectionEndpoint).object) {
          Errors::cannotReuseImplicitProcessorInstance<>();
          AST::Context::throwError(c,&local_a0,false);
        }
        pPVar9 = PoolAllocator::
                 allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorInstance>&>
                           (&((local_160->super_ModuleInstanceResolver).
                              super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,&local_130);
        goto LAB_0021b46b;
      }
    }
    ppVar10 = ppVar10 + 1;
  } while( true );
}

Assistant:

AST::ProcessorInstanceRef& getOrCreateImplicitProcessorInstance (AST::Context& c,
                                                                         AST::ProcessorBase& processor,
                                                                         pool_ptr<AST::Expression> arguments)
        {
            auto signature = ASTUtilities::getSpecialisationSignature (processor.specialisationParams,
                                                                       AST::CommaSeparatedList::getAsExpressionList (arguments));

            auto currentGraph = cast<AST::Graph> (currentModule);
            SOUL_ASSERT (currentGraph != nullptr);

            for (auto i : currentGraph->processorInstances)
            {
                if (i->targetProcessor->getAsProcessor() == processor
                     && signature == ASTUtilities::getSpecialisationSignature (processor.specialisationParams,
                                                                               AST::CommaSeparatedList::getAsExpressionList (i->specialisationArgs)))
                {
                    if (i->implicitInstanceSource == nullptr)
                        c.throwError (Errors::cannotUseProcessorInLet (processor.name));

                    if (i->implicitInstanceSource != currentConnectionEndpoint)
                        c.throwError (Errors::cannotReuseImplicitProcessorInstance());

                    return allocator.allocate<AST::ProcessorInstanceRef> (c, i);
                }
            }

            auto& i = allocator.allocate<AST::ProcessorInstance> (c);

            if (arguments == nullptr)
            {
                i.instanceName = allocator.allocate<AST::UnqualifiedName> (c, processor.name);
            }
            else
            {
                auto name = currentGraph->makeUniqueName ("_instance_" + processor.name.toString());
                i.instanceName = allocator.allocate<AST::UnqualifiedName> (c, allocator.get (name));
            }

            i.targetProcessor = allocator.allocate<AST::ProcessorRef> (c, processor);
            i.specialisationArgs = arguments;
            i.implicitInstanceSource = currentConnectionEndpoint;
            currentGraph->addProcessorInstance (i);
            return allocator.allocate<AST::ProcessorInstanceRef> (c, i);
        }